

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbc1.c
# Opt level: O3

gbstatus_e mbc1_init(gb_cart_t *cart)

{
  void *pvVar1;
  
  if (cart != (gb_cart_t *)0x0) {
    pvVar1 = calloc(1,2);
    cart->mbc_state = pvVar1;
    if (pvVar1 == (void *)0x0) {
      builtin_strncpy(gbstatus_str + 0x10,"te memory",10);
      builtin_strncpy(gbstatus_str,"unable to alloca",0x10);
    }
    return (uint)(pvVar1 == (void *)0x0);
  }
  __assert_fail("cart != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/mbc1.c"
                ,0x16,"gbstatus_e mbc1_init(gb_cart_t *)");
}

Assistant:

gbstatus_e mbc1_init(gb_cart_t *cart)
{
    gbstatus_e status = GBSTATUS_OK;

    assert(cart != NULL);

    cart->mbc_state = calloc(1, sizeof(mbc1_state_t));
    if (cart->mbc_state == NULL)
    {
        GBSTATUS(GBSTATUS_BAD_ALLOC, "unable to allocate memory");
        return status;
    }

    return GBSTATUS_OK;
}